

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

_Bool mainchan_rcvd_exit_signal_numeric(Channel *chan,int signum,_Bool core_dumped,ptrlen msg)

{
  char *sigdesc;
  char *signum_str;
  mainchan *mc;
  _Bool core_dumped_local;
  int signum_local;
  Channel *chan_local;
  ptrlen msg_local;
  
  if (chan->vt == &mainchan_channelvt) {
    ssh_got_exitcode(*(Ssh **)(*(long *)&chan[-4].initial_fixed_window_size + 0x58),signum + 0x80);
    sigdesc = dupprintf("signal %d",(ulong)(uint)signum);
    mainchan_log_exit_signal_common
              ((mainchan *)&chan[-5].initial_fixed_window_size,sigdesc,core_dumped,msg);
    safefree(sigdesc);
    return true;
  }
  __assert_fail("chan->vt == &mainchan_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/mainchan.c",
                0x1c8,"_Bool mainchan_rcvd_exit_signal_numeric(Channel *, int, _Bool, ptrlen)");
}

Assistant:

static bool mainchan_rcvd_exit_signal_numeric(
    Channel *chan, int signum, bool core_dumped, ptrlen msg)
{
    assert(chan->vt == &mainchan_channelvt);
    mainchan *mc = container_of(chan, mainchan, chan);
    char *signum_str;

    ssh_got_exitcode(mc->ppl->ssh, 128 + signum);
    signum_str = dupprintf("signal %d", signum);
    mainchan_log_exit_signal_common(mc, signum_str, core_dumped, msg);
    sfree(signum_str);
    return true;
}